

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Lexer::CreateSymbol(Lexer *this,int64_t integer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  value_type local_50;
  
  local_50.type = IntegerValue;
  paVar1 = &local_50.text.field_2;
  local_50.text._M_string_length = 0;
  local_50.text.field_2._M_local_buf[0] = '\0';
  uVar2 = this->m_columnMarker;
  uVar3 = this->m_lineNumber;
  local_50.columnNumber = uVar2;
  local_50.lineNumber = uVar3;
  local_50.text._M_dataplus._M_p = (pointer)paVar1;
  local_50.field_2.intVal = integer;
  std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::push_back
            (&this->m_symbolList,&local_50);
  this->m_columnMarker = this->m_columnNumber;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_50.text._M_dataplus._M_p != paVar1) {
    MemFree(local_50.text._M_dataplus._M_p,
            CONCAT71(local_50.text.field_2._M_allocated_capacity._1_7_,
                     local_50.text.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

inline_t void Lexer::CreateSymbol(int64_t integer)
	{
		Symbol symbol(SymbolType::IntegerValue, m_lineNumber, m_columnMarker);
		symbol.intVal = integer;
		m_symbolList.push_back(symbol);
		m_columnMarker = m_columnNumber;
	}